

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::LookupSymbol
          (ElfMemImage *this,char *name,char *version,int type,SymbolInfo *info_out)

{
  bool bVar1;
  int iVar2;
  SymbolInfo *pSVar3;
  SymbolInfo *info;
  SymbolIterator __end2;
  SymbolIterator __begin2;
  ElfMemImage *__range2;
  SymbolInfo *info_out_local;
  int type_local;
  char *version_local;
  char *name_local;
  ElfMemImage *this_local;
  
  begin((SymbolIterator *)&__end2.image_,this);
  end((SymbolIterator *)&info,this);
  while( true ) {
    bVar1 = SymbolIterator::operator!=((SymbolIterator *)&__end2.image_,(SymbolIterator *)&info);
    if (!bVar1) {
      return false;
    }
    pSVar3 = SymbolIterator::operator*((SymbolIterator *)&__end2.image_);
    iVar2 = strcmp(pSVar3->name,name);
    if (((iVar2 == 0) && (iVar2 = strcmp(pSVar3->version,version), iVar2 == 0)) &&
       (iVar2 = anon_unknown_1::ElfType(pSVar3->symbol), iVar2 == type)) break;
    SymbolIterator::operator++((SymbolIterator *)&__end2.image_);
  }
  if (info_out != (SymbolInfo *)0x0) {
    info_out->name = pSVar3->name;
    info_out->version = pSVar3->version;
    info_out->address = pSVar3->address;
    info_out->symbol = pSVar3->symbol;
  }
  return true;
}

Assistant:

bool ElfMemImage::LookupSymbol(const char *name,
                               const char *version,
                               int type,
                               SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    if (strcmp(info.name, name) == 0 && strcmp(info.version, version) == 0 &&
        ElfType(info.symbol) == type) {
      if (info_out) {
        *info_out = info;
      }
      return true;
    }
  }
  return false;
}